

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___call(lua_State *L)

{
  CTState *cts_00;
  int iVar1;
  GCcdata *cd_00;
  cTValue *tv_00;
  GCstr *pGVar2;
  MMS local_bc;
  int ret;
  MMS mm;
  cTValue *tv;
  CType *ct;
  CTypeID id;
  GCcdata *cd;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  CType *local_70;
  CType *ct_1;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  cd_00 = ffi_checkcdata(L,1);
  ct._4_4_ = (uint)cd_00->ctypeid;
  local_bc = MM_call;
  if (cd_00->ctypeid == 0x16) {
    ct._4_4_ = (uint)cd_00[1].nextgc.gcptr64;
    local_bc = MM_new;
  }
  else {
    iVar1 = lj_ccall_func(L,cd_00);
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  for (local_70 = cts_00->tab + ct._4_4_; local_70->info >> 0x1c == 8;
      local_70 = cts_00->tab + (local_70->info & 0xffff)) {
  }
  if (local_70->info >> 0x1c == 2) {
    ct._4_4_ = local_70->info & 0xffff;
  }
  tv_00 = lj_ctype_meta(cts_00,ct._4_4_,local_bc);
  if (tv_00 == (cTValue *)0x0) {
    if (local_bc == MM_call) {
      pGVar2 = lj_ctype_repr(L,ct._4_4_,(GCstr *)0x0);
      lj_err_callerv(L,LJ_ERR_FFI_BADCALL,pGVar2 + 1);
    }
    L_local._4_4_ = lj_cf_ffi_new(L);
  }
  else {
    L_local._4_4_ = lj_meta_tailcall(L,tv_00);
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}